

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O1

void cfd::core::logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,anon_enum_32 *args,
               AddressType *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar3;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string local_88;
  ulong local_68 [2];
  ulong local_58;
  pointer local_48;
  size_type sStack_40;
  
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )args_2;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_68[0] = (ulong)(uint)*args;
    local_58 = (ulong)*args_1;
    local_48 = (args_2->_M_dataplus)._M_p;
    sStack_40 = args_2->_M_string_length;
    pcVar2 = (char *)strlen(fmt);
    format_str.size_ = 0xd22;
    format_str.data_ = pcVar2;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar3.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_68;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)fmt,format_str,args_00);
    WriteLog(source,lvl,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}